

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O0

bool __thiscall
FOptionMenuScreenResolutionLine::SetValue(FOptionMenuScreenResolutionLine *this,int i,int v)

{
  int v_local;
  int i_local;
  FOptionMenuScreenResolutionLine *this_local;
  
  if (i == 0x30003) {
    this->mSelection = v;
    this_local._7_1_ = true;
  }
  else if (i == 0x30004) {
    this->mHighlight = v;
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool SetValue(int i, int v)
	{
		if (i == SRL_SELECTION)
		{
			mSelection = v;
			return true;
		}
		else if (i == SRL_HIGHLIGHT)
		{
			mHighlight = v;
			return true;
		}
		return false;
	}